

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *
Catch::filterTests(vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases,
                  TestSpec *testSpec,IConfig *config)

{
  bool bVar1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_RCX;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_RSI;
  value_type *in_RDI;
  const_iterator itEnd;
  const_iterator it;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *filtered;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  value_type *testCase;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_40 [3];
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar2;
  
  uVar2 = 0;
  testCase = in_RDI;
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)0x187d7f);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::size(in_RSI);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::reserve
            (in_RCX,CONCAT17(uVar2,in_stack_ffffffffffffffd8));
  local_40[0]._M_current =
       (TestCase *)
       std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                 (in_stack_ffffffffffffff98);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end(in_stack_ffffffffffffff98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                            (__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)in_stack_ffffffffffffff98), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator*(local_40);
    in_stack_ffffffffffffffa7 =
         matchTest(testCase,(TestSpec *)in_RDI,
                   (IConfig *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    if ((bool)in_stack_ffffffffffffffa7) {
      __gnu_cxx::
      __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
      ::operator*(local_40);
      std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
                ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)testCase,in_RDI);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(local_40);
  }
  return (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)in_RDI;
}

Assistant:

std::vector<TestCase> filterTests( std::vector<TestCase> const& testCases, TestSpec const& testSpec, IConfig const& config ) {
        std::vector<TestCase> filtered;
        filtered.reserve( testCases.size() );
        for( std::vector<TestCase>::const_iterator it = testCases.begin(), itEnd = testCases.end();
                it != itEnd;
                ++it )
            if( matchTest( *it, testSpec, config ) )
                filtered.push_back( *it );
        return filtered;
    }